

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_decompress.c
# Opt level: O0

_Bool build_offset_decode_table
                (libdeflate_decompressor *d,uint num_litlen_syms,uint num_offset_syms)

{
  _Bool _Var1;
  uint in_stack_000000a0;
  uint in_stack_000000a4;
  u32 *in_stack_000000a8;
  uint in_stack_000000b4;
  u8 *in_stack_000000b8;
  u32 *in_stack_000000c0;
  u16 *in_stack_00000110;
  uint *in_stack_00000118;
  
  _Var1 = build_decode_table(in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000a8
                             ,in_stack_000000a4,in_stack_000000a0,in_stack_00000110,
                             in_stack_00000118);
  return _Var1;
}

Assistant:

static bool
build_offset_decode_table(struct libdeflate_decompressor *d,
			  unsigned num_litlen_syms, unsigned num_offset_syms)
{
	/* When you change TABLEBITS, you must change ENOUGH, and vice versa! */
	STATIC_ASSERT(OFFSET_TABLEBITS == 8 && OFFSET_ENOUGH == 402);

	STATIC_ASSERT(ARRAY_LEN(offset_decode_results) ==
		      DEFLATE_NUM_OFFSET_SYMS);

	return build_decode_table(d->offset_decode_table,
				  d->u.l.lens + num_litlen_syms,
				  num_offset_syms,
				  offset_decode_results,
				  OFFSET_TABLEBITS,
				  DEFLATE_MAX_OFFSET_CODEWORD_LEN,
				  d->sorted_syms,
				  NULL);
}